

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::removeAlmostSignExt(OptimizeInstructions *this,Binary *outer)

{
  Expression *pEVar1;
  bool bVar2;
  char *__function;
  Literal *this_00;
  Literal *other;
  Expression *pEVar3;
  Literal local_40;
  
  pEVar1 = outer->left;
  if (pEVar1->_id == BinaryId) {
    if ((outer->right->_id == ConstId) && (**(char **)(pEVar1 + 2) == '\x0e')) {
      pEVar3 = (Expression *)pEVar1[1].type.id;
      this_00 = (Literal *)(outer->right + 1);
      other = (Literal *)(*(char **)(pEVar1 + 2) + 0x10);
      bVar2 = Literal::operator==(this_00,other);
      if (!bVar2) {
        Literal::sub(&local_40,other,this_00);
        Literal::operator=(other,&local_40);
        Literal::~Literal(&local_40);
        pEVar3 = pEVar1;
      }
      return pEVar3;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::Const]";
  }
  else {
    __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,__function);
}

Assistant:

Expression* removeAlmostSignExt(Binary* outer) {
    auto* inner = outer->left->cast<Binary>();
    auto* outerConst = outer->right->cast<Const>();
    auto* innerConst = inner->right->cast<Const>();
    auto* value = inner->left;
    if (outerConst->value == innerConst->value) {
      return value;
    }
    // add a shift, by reusing the existing node
    innerConst->value = innerConst->value.sub(outerConst->value);
    return inner;
  }